

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::MemoryModuleField::~MemoryModuleField(MemoryModuleField *this)

{
  ~MemoryModuleField(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit MemoryModuleField(const Location& loc = Location(),
                             std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::Memory>(loc), memory(name) {}